

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printSeq(JSPrinter *this,Ref node)

{
  size_t sVar1;
  undefined8 *puVar2;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  printChild(this,(Value *)*puVar2,local_20,-1);
  maybeSpace(this,',');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = ',';
  space(this);
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  printChild(this,(Value *)*puVar2,local_20,1);
  return;
}

Assistant:

void printSeq(Ref node) {
    printChild(node[1], node, -1);
    emit(',');
    space();
    printChild(node[2], node, 1);
  }